

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O2

void __thiscall cppnet::PoolAlloter::PoolAlloter(PoolAlloter *this)

{
  __shared_ptr<cppnet::NormalAlloter,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  (this->super_Alloter)._vptr_Alloter = (_func_int **)&PTR__PoolAlloter_00125700;
  this->_pool_start = (char *)0x0;
  this->_pool_end = (char *)0x0;
  (this->_free_list).
  super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_free_list).
  super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_free_list).
  super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>::
  resize(&this->_free_list,0x20);
  memset((this->_free_list).
         super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
         ._M_impl.super__Vector_impl_data._M_start,0,0x100);
  MakeNormalAlloterPtr();
  std::__shared_ptr<cppnet::Alloter,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<cppnet::Alloter,(__gnu_cxx::_Lock_policy)2> *)&this->_alloter,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

PoolAlloter::PoolAlloter() : 
    _pool_start(nullptr),
    _pool_end(nullptr) {
    _free_list.resize(__default_number_of_free_lists);
    memset(&(*_free_list.begin()), 0, sizeof(void*) * __default_number_of_free_lists);
    _alloter = MakeNormalAlloterPtr();
}